

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O2

TPZTransform<double> *
pztopology::Pr<pztopology::TPZPoint>::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  int *piVar1;
  int iVar2;
  int row;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  TPZStack<int,_10> highsides;
  TPZTransform<double> local_500;
  TPZTransform<double> toside;
  TPZTransform<double> toelement;
  
  if ((uint)sidefrom < 3 && (uint)sideto < 3) {
    if (sidefrom != sideto) {
      if (sidefrom == 2) {
        TransformElementToSide(__return_storage_ptr__,sideto);
        return __return_storage_ptr__;
      }
      TPZStack<int,_10>::TPZStack(&highsides);
      HigherDimensionSides(sidefrom,&highsides);
      uVar5 = 0;
      uVar4 = (ulong)(uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
      if ((int)(uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
        uVar4 = uVar5;
      }
      do {
        if (uVar4 == uVar5) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Pr<TFather>::SideToSideTransform highside not found sidefrom ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,sidefrom);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,sideto);
          std::endl<char,std::char_traits<char>>(poVar3);
          TPZTransform<double>::TPZTransform(__return_storage_ptr__,0);
          goto LAB_00dee4b9;
        }
        piVar1 = highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore + uVar5;
        uVar5 = uVar5 + 1;
      } while (*piVar1 != sideto);
      iVar2 = SideDimension(sidefrom);
      row = SideDimension(sideto);
      TPZTransform<double>::TPZTransform(__return_storage_ptr__,row,iVar2);
      TPZTransform<double>::TPZTransform(&toelement,1,sidefrom);
      TPZTransform<double>::TPZTransform(&toside,sideto,1);
      TransformSideToElement(&local_500,sidefrom);
      TPZTransform<double>::operator=(&toelement,&local_500);
      TPZTransform<double>::~TPZTransform(&local_500);
      TransformElementToSide(&local_500,sideto);
      TPZTransform<double>::operator=(&toside,&local_500);
      TPZTransform<double>::~TPZTransform(&local_500);
      TPZTransform<double>::Multiply(&local_500,&toside,&toelement);
      TPZTransform<double>::operator=(__return_storage_ptr__,&local_500);
      TPZTransform<double>::~TPZTransform(&local_500);
      TPZTransform<double>::~TPZTransform(&toside);
      TPZTransform<double>::~TPZTransform(&toelement);
LAB_00dee4b9:
      TPZManVector<int,_10>::~TPZManVector(&highsides.super_TPZManVector<int,_10>);
      return __return_storage_ptr__;
    }
    iVar2 = SideDimension(sidefrom);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::HigherDimensionSides sidefrom ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sidefrom);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sideto);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 0;
  }
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,iVar2);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> Pr<TFather>::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "Pr<TFather>::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(SideDimension(sidefrom));
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
		TPZStack<int> highsides;
		HigherDimensionSides(sidefrom,highsides);
		int nhigh = highsides.NElements();
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[is] == sideto) {
				int dfr = SideDimension(sidefrom);
				int dto = SideDimension(sideto);
				TPZTransform<> trans(dto,dfr),toelement(Dimension,sidefrom),toside(sideto,Dimension);
				toelement = TransformSideToElement(sidefrom);
				toside = TransformElementToSide(sideto);
				trans = toside.Multiply(toelement);
				return trans;
			}
		}
		PZError << "Pr<TFather>::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}